

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O3

void __thiscall Pl_Base64::finish(Pl_Base64 *this)

{
  ulong uVar1;
  logic_error *this_00;
  
  uVar1 = this->pos;
  if (uVar1 != 0) {
    if (this->finished == true) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_Base64 used after finished");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (uVar1 < 4 && this->action == a_decode) {
      memset(this->buf + uVar1,0x3d,4 - uVar1);
    }
    flush(this);
  }
  this->finished = true;
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_Base64::finish()
{
    if (this->pos > 0) {
        if (finished) {
            throw std::logic_error("Pl_Base64 used after finished");
        }
        if (this->action == a_decode) {
            for (size_t i = this->pos; i < 4; ++i) {
                this->buf[i] = '=';
            }
        }
        flush();
    }
    this->finished = true;
    next()->finish();
}